

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::clear(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->nStored != 0) {
    lVar3 = 0x10;
    uVar4 = 0;
    do {
      plVar1 = *(long **)((long)this->ptr + lVar3 + -0x10);
      plVar2 = (long *)((long)&(this->ptr->_M_dataplus)._M_p + lVar3);
      if (plVar2 != plVar1) {
        operator_delete(plVar1,*plVar2 + 1);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar4 < this->nStored);
  }
  this->nStored = 0;
  return;
}

Assistant:

void clear() {
        for (int i = 0; i < nStored; ++i)
            alloc.destroy(&ptr[i]);
        nStored = 0;
    }